

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void dumpProfileFab(FArrayBox *fab,string *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ofstream osf;
  char local_24d;
  Box local_24c;
  undefined1 local_230 [8];
  ostream *local_228;
  long local_220;
  undefined8 auStack_218 [28];
  ios_base local_138 [264];
  
  local_24c.smallend.vect[2] = (fab->super_BaseFab<double>).domain.smallend.vect[2];
  local_24c.smallend.vect[0] =
       (int)((double)((fab->super_BaseFab<double>).domain.bigend.vect[0] +
                     (fab->super_BaseFab<double>).domain.smallend.vect[0]) * 0.5);
  local_24c.bigend.vect[2] = (fab->super_BaseFab<double>).domain.bigend.vect[2];
  local_24c.smallend.vect[1] = 0x73;
  local_24c.bigend.vect[1] = 0x7d;
  local_24c.btype.itype = 0;
  local_24c.bigend.vect[0] = local_24c.smallend.vect[0];
  local_228 = amrex::OutStream();
  local_230._4_4_ = *(MPI_Comm *)(DAT_0071a620 + -0x48);
  local_230._0_4_ = *(int *)(DAT_0071a620 + -0x30);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_220);
  *(undefined8 *)((long)auStack_218 + *(long *)(local_220 + -0x18)) =
       *(undefined8 *)(local_228 + *(long *)(*(long *)local_228 + -0x18) + 8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"dumping over ",0xd);
  amrex::operator<<((ostream *)&local_220,&local_24c);
  local_24d = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,&local_24d,1);
  amrex::Print::~Print((Print *)local_230);
  std::ofstream::ofstream(local_230,(file->_M_dataplus)._M_p,_S_out);
  iVar8 = local_24c.smallend.vect[2];
  iVar10 = local_24c.smallend.vect[0];
  iVar5 = local_24c.smallend.vect[1];
  if (local_24c.smallend.vect[2] <= local_24c.bigend.vect[2]) {
    do {
      if ((local_24c.bigend.vect[2] == iVar8) &&
         ((local_24c.bigend.vect[1] < iVar5 ||
          ((local_24c.bigend.vect[1] == iVar5 && (local_24c.bigend.vect[0] < iVar10)))))) break;
      poVar4 = (ostream *)std::ostream::operator<<(local_230,iVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      poVar4 = std::ostream::_M_insert<double>(((double)iVar5 + 0.5) * 3.5 * 0.00390625);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if (0 < (fab->super_BaseFab<double>).nvar) {
        lVar9 = 0;
        do {
          iVar1 = (fab->super_BaseFab<double>).domain.smallend.vect[0];
          iVar2 = (fab->super_BaseFab<double>).domain.smallend.vect[1];
          iVar6 = ((fab->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1;
          iVar3 = (fab->super_BaseFab<double>).domain.smallend.vect[2];
          iVar7 = ((fab->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1;
          poVar4 = std::ostream::_M_insert<double>
                             ((fab->super_BaseFab<double>).dptr
                              [(long)(iVar10 - iVar1) +
                               (long)(((iVar8 - iVar3) * iVar7 + (iVar5 - iVar2)) * iVar6) +
                               iVar6 * lVar9 *
                               (long)(((fab->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) +
                                     1) * (long)iVar7]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
          lVar9 = lVar9 + 1;
        } while (lVar9 < (fab->super_BaseFab<double>).nvar);
      }
      local_24d = '\n';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,&local_24d,1);
      if (iVar10 < local_24c.bigend.vect[0]) {
        iVar10 = iVar10 + 1;
      }
      else {
        iVar10 = local_24c.smallend.vect[0];
        if (iVar5 < local_24c.bigend.vect[1]) {
          iVar5 = iVar5 + 1;
        }
        else {
          iVar8 = iVar8 + 1;
          iVar5 = local_24c.smallend.vect[1];
        }
      }
    } while (iVar8 <= local_24c.bigend.vect[2]);
  }
  amrex::Abort_host((char *)0x0);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void dumpProfileFab(const FArrayBox& fab,
                    const std::string& file)
{
  const Box& box = fab.box();
  int imid = (int)(0.5*(box.smallEnd()[0] + box.bigEnd()[0]));
  IntVect iv1 = box.smallEnd(); iv1[0] = imid;
  IntVect iv2 = box.bigEnd(); iv2[0] = imid;
  iv1[1] = 115; iv2[1]=125;
  Box pb(iv1,iv2);
  amrex::Print() << "dumping over " << pb << '\n';

  std::ofstream osf(file.c_str());
  for (IntVect iv = pb.smallEnd(); iv <= pb.bigEnd(); pb.next(iv))
  {
    osf << iv[1] << " " << (iv[1]+0.5)*3.5/256 << " ";
    for (int n=0; n<fab.nComp(); ++n)
      osf << fab(iv,n) << " ";
    osf << '\n';
  }
  amrex::Abort();
}